

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

ForStreamable<Explicit,_std::string> *
lest::make_string<Explicit>
          (ForStreamable<Explicit,_std::string> *__return_storage_ptr__,Explicit *item)

{
  ostringstream os;
  char *local_1b0;
  size_type local_1a8;
  char local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  ::operator<<((ostream *)local_190,(Explicit)item->x);
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1b0 == &local_1a0) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_19f,local_1a0);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_198;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1b0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_19f,local_1a0);
  }
  __return_storage_ptr__->_M_string_length = local_1a8;
  local_1a8 = 0;
  local_1a0 = '\0';
  local_1b0 = &local_1a0;
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( T const & item ) -> ForStreamable<T, std::string>
{
    std::ostringstream os; os << item; return os.str();
}